

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDGrammar.hpp
# Opt level: O3

XMLNotationDecl * __thiscall
xercesc_4_0::DTDGrammar::getNotationDecl(DTDGrammar *this,XMLCh *notName)

{
  NameIdPool<xercesc_4_0::XMLNotationDecl> *pNVar1;
  bool bVar2;
  ulong uVar3;
  XMLCh *pXVar4;
  XMLCh XVar5;
  RefHashTableBucketElem<xercesc_4_0::XMLNotationDecl> *pRVar6;
  
  pNVar1 = this->fNotationDeclPool;
  if (pNVar1->fIdCounter != 0) {
    if ((notName == (XMLCh *)0x0) || (uVar3 = (ulong)(ushort)*notName, uVar3 == 0)) {
      uVar3 = 0;
    }
    else {
      XVar5 = notName[1];
      if (XVar5 != L'\0') {
        pXVar4 = notName + 2;
        do {
          uVar3 = (ulong)(ushort)XVar5 + (uVar3 >> 0x18) + uVar3 * 0x26;
          XVar5 = *pXVar4;
          pXVar4 = pXVar4 + 1;
        } while (XVar5 != L'\0');
      }
      uVar3 = uVar3 % (pNVar1->fBucketList).fHashModulus;
    }
    pRVar6 = (pNVar1->fBucketList).fBucketList[uVar3];
    if (pRVar6 != (RefHashTableBucketElem<xercesc_4_0::XMLNotationDecl> *)0x0) {
      do {
        bVar2 = StringHasher::equals
                          ((StringHasher *)&(pNVar1->fBucketList).field_0x30,notName,pRVar6->fKey);
        if (bVar2) {
          return pRVar6->fData;
        }
        pRVar6 = pRVar6->fNext;
      } while (pRVar6 != (RefHashTableBucketElem<xercesc_4_0::XMLNotationDecl> *)0x0);
      return (XMLNotationDecl *)0x0;
    }
  }
  return (XMLNotationDecl *)0x0;
}

Assistant:

inline const XMLNotationDecl* DTDGrammar::getNotationDecl(const XMLCh* const notName) const
{
    return fNotationDeclPool->getByKey(notName);
}